

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

bool chaiscript::dispatch::detail::
     compare_types_cast<chaiscript::Boxed_Value,chaiscript::Boxed_Value&,std::__cxx11::string_const&>
               (_func_Boxed_Value_Boxed_Value_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
                *param_1,Function_Params *params,Type_Conversions_State *t_conversions)

{
  Boxed_Value *pBVar1;
  bad_boxed_cast *anon_var_0;
  size_type i;
  Type_Conversions_State *t_conversions_local;
  Function_Params *params_local;
  _func_Boxed_Value_Boxed_Value_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  *param_0_local;
  
  pBVar1 = Function_Params::operator[](params,0);
  boxed_cast<chaiscript::Boxed_Value&>(pBVar1,t_conversions);
  pBVar1 = Function_Params::operator[](params,1);
  boxed_cast<std::__cxx11::string_const&>(pBVar1,t_conversions);
  return true;
}

Assistant:

bool compare_types_cast(Ret (*)(Params...), const chaiscript::Function_Params &params, const Type_Conversions_State &t_conversions) noexcept {
        try {
          std::vector<Boxed_Value>::size_type i = 0;
          (boxed_cast<Params>(params[i++], &t_conversions), ...);
          return true;
        } catch (const exception::bad_boxed_cast &) {
          return false;
        }
      }